

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenmesh::scarveholes(tetgenmesh *this,int holes,double *holelist)

{
  arraypool **ppaVar1;
  uint *puVar2;
  ulong uVar3;
  long lVar4;
  undefined8 *puVar5;
  memorypool *pmVar6;
  shellface *pppdVar7;
  locateresult lVar8;
  char *pcVar9;
  arraypool *paVar10;
  arraypool **ppaVar11;
  arraypool *paVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  double *searchpt;
  ulong uVar16;
  undefined4 in_register_00000034;
  long lVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  face local_58;
  undefined8 local_48;
  double *local_40;
  long local_38;
  
  local_48 = CONCAT44(in_register_00000034,holes);
  local_58.sh = (shellface *)0x0;
  puVar2 = (uint *)((long)(this->recentsh).sh + (long)this->shmarkindex * 4 + 4);
  *puVar2 = *puVar2 | 2;
  ppaVar1 = &this->caveshlist;
  paVar10 = this->caveshlist;
  local_40 = holelist;
  pcVar9 = arraypool::getblock(paVar10,(int)paVar10->objects);
  lVar17 = (long)paVar10->objectbytes * ((long)paVar10->objectsperblock - 1U & paVar10->objects);
  paVar10->objects = paVar10->objects + 1;
  *(shellface **)(pcVar9 + lVar17) = (this->recentsh).sh;
  *(int *)(pcVar9 + lVar17 + 8) = (this->recentsh).shver;
  paVar10 = this->caveshlist;
  if (0 < paVar10->objects) {
    lVar17 = 0;
    do {
      uVar3 = *(ulong *)(paVar10->toparray
                         [(uint)lVar17 >> ((byte)paVar10->log2objectsperblock & 0x1f)] +
                        (long)paVar10->objectbytes *
                        (long)(int)(paVar10->objectsperblockmark & (uint)lVar17));
      iVar19 = 3;
      uVar14 = 0;
      local_38 = lVar17;
      do {
        uVar16 = *(ulong *)(uVar3 + (long)((int)uVar14 >> 1) * 8);
        uVar15 = uVar16 & 0xfffffffffffffff8;
        if (uVar15 == 0) {
          if (*(long *)(uVar3 + 0x30 + (long)((int)uVar14 >> 1) * 8) == 0) {
            uVar13 = *(uint *)(uVar3 + 4 + (long)this->shmarkindex * 4);
            if ((uVar13 & 1) == 0) {
              *(uint *)(uVar3 + 4 + (long)this->shmarkindex * 4) = uVar13 | 1;
              ppaVar11 = &this->caveshbdlist;
              uVar15 = uVar3;
              uVar13 = uVar14;
              goto LAB_0012e33b;
            }
          }
        }
        else {
          uVar13 = *(uint *)(uVar15 + 4 + (long)this->shmarkindex * 4);
          if ((uVar13 & 2) == 0) {
            *(uint *)(uVar15 + 4 + (long)this->shmarkindex * 4) = uVar13 | 2;
            ppaVar11 = ppaVar1;
            uVar13 = (uint)uVar16 & 7;
LAB_0012e33b:
            paVar10 = *ppaVar11;
            pcVar9 = arraypool::getblock(paVar10,(int)paVar10->objects);
            lVar17 = (long)paVar10->objectbytes *
                     ((long)paVar10->objectsperblock - 1U & paVar10->objects);
            paVar10->objects = paVar10->objects + 1;
            *(ulong *)(pcVar9 + lVar17) = uVar15;
            *(uint *)(pcVar9 + lVar17 + 8) = uVar13;
          }
        }
        uVar14 = snextpivot[(int)uVar14];
        iVar19 = iVar19 + -1;
      } while (iVar19 != 0);
      lVar17 = local_38 + 1;
      paVar10 = *ppaVar1;
    } while (lVar17 < paVar10->objects);
  }
  iVar19 = (int)local_48;
  if (0 < iVar19) {
    iVar20 = 0;
    searchpt = local_40;
    do {
      local_58.sh = (this->recentsh).sh;
      local_58.shver = (this->recentsh).shver;
      lVar8 = slocate(this,searchpt,&local_58,1,1,0);
      pppdVar7 = local_58.sh;
      if (lVar8 != OUTSIDE) {
        puVar2 = (uint *)((long)local_58.sh + (long)this->shmarkindex * 4 + 4);
        *puVar2 = *puVar2 | 1;
        paVar10 = this->caveshbdlist;
        pcVar9 = arraypool::getblock(paVar10,(int)paVar10->objects);
        lVar17 = (long)paVar10->objectbytes *
                 ((long)paVar10->objectsperblock - 1U & paVar10->objects);
        paVar10->objects = paVar10->objects + 1;
        *(shellface **)(pcVar9 + lVar17) = pppdVar7;
        *(int *)(pcVar9 + lVar17 + 8) = local_58.shver;
      }
      searchpt = searchpt + 3;
      iVar20 = iVar20 + 3;
    } while (iVar20 < iVar19 * 3);
  }
  paVar10 = this->caveshbdlist;
  if (0 < paVar10->objects) {
    lVar17 = 0;
    do {
      lVar4 = *(long *)(paVar10->toparray
                        [(uint)lVar17 >> ((byte)paVar10->log2objectsperblock & 0x1f)] +
                       (long)paVar10->objectbytes *
                       (long)(int)(paVar10->objectsperblockmark & (uint)lVar17));
      iVar20 = 3;
      iVar19 = 0;
      do {
        uVar3 = *(ulong *)(lVar4 + (long)(iVar19 >> 1) * 8);
        uVar16 = uVar3 & 0xfffffffffffffff8;
        if (uVar16 != 0) {
          uVar14 = (uint)uVar3;
          if (*(long *)(lVar4 + 0x30 + (long)(iVar19 >> 1) * 8) == 0) {
            uVar13 = *(uint *)(uVar16 + 4 + (long)this->shmarkindex * 4);
            if ((uVar13 & 1) == 0) {
              *(uint *)(uVar16 + 4 + (long)this->shmarkindex * 4) = uVar13 | 1;
              paVar10 = this->caveshbdlist;
              pcVar9 = arraypool::getblock(paVar10,(int)paVar10->objects);
              lVar18 = (long)paVar10->objectbytes *
                       ((long)paVar10->objectsperblock - 1U & paVar10->objects);
              paVar10->objects = paVar10->objects + 1;
              *(ulong *)(pcVar9 + lVar18) = uVar16;
              *(uint *)(pcVar9 + lVar18 + 8) = uVar14 & 7;
            }
          }
          else {
            *(undefined8 *)(uVar16 + (ulong)(uVar14 & 6) * 4) = 0;
          }
        }
        iVar19 = snextpivot[iVar19];
        iVar20 = iVar20 + -1;
      } while (iVar20 != 0);
      lVar17 = lVar17 + 1;
      paVar10 = this->caveshbdlist;
    } while (lVar17 < paVar10->objects);
  }
  paVar12 = *ppaVar1;
  if (0 < paVar12->objects) {
    lVar17 = 0;
    do {
      puVar5 = *(undefined8 **)
                (paVar12->toparray[(uint)lVar17 >> ((byte)paVar12->log2objectsperblock & 0x1f)] +
                (long)paVar12->objectbytes *
                (long)(int)(paVar12->objectsperblockmark & (uint)lVar17));
      uVar14 = *(uint *)((long)puVar5 + (long)this->shmarkindex * 4 + 4);
      if ((uVar14 & 1) == 0) {
        *(uint *)((long)puVar5 + (long)this->shmarkindex * 4 + 4) = uVar14 & 0xfffffffc;
      }
      else {
        pmVar6 = this->subfaces;
        puVar5[3] = 0;
        *puVar5 = pmVar6->deaditemstack;
        pmVar6->deaditemstack = puVar5;
        pmVar6->items = pmVar6->items + -1;
        paVar12 = this->caveshlist;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < paVar12->objects);
    paVar10 = this->caveshbdlist;
  }
  paVar12->objects = 0;
  paVar10->objects = 0;
  return;
}

Assistant:

void tetgenmesh::scarveholes(int holes, REAL* holelist)
{
  face *parysh, searchsh, neighsh;
  enum locateresult loc;
  int i, j;

  // Get all triangles. Infect unprotected convex hull triangles. 
  smarktest(recentsh);
  caveshlist->newindex((void **) &parysh);
  *parysh = recentsh;
  for (i = 0; i < caveshlist->objects; i++) {
    parysh = (face *) fastlookup(caveshlist, i);
    searchsh = *parysh;
    searchsh.shver = 0;
    for (j = 0; j < 3; j++) {
      spivot(searchsh, neighsh);
      // Is this side on the convex hull?
      if (neighsh.sh != NULL) {
        if (!smarktested(neighsh)) {
          smarktest(neighsh);
          caveshlist->newindex((void **) &parysh);
          *parysh = neighsh;
        }
      } else {
        // A hull side. Check if it is protected by a segment.
        if (!isshsubseg(searchsh)) {
          // Not protected. Save this face.
          if (!sinfected(searchsh)) {
            sinfect(searchsh);
            caveshbdlist->newindex((void **) &parysh);
            *parysh = searchsh;
          }
        }
      }
      senextself(searchsh);
    }
  }

  // Infect the triangles in the holes.
  for (i = 0; i < 3 * holes; i += 3) {
    searchsh = recentsh;
    loc = slocate(&(holelist[i]), &searchsh, 1, 1, 0);
    if (loc != OUTSIDE) {
      sinfect(searchsh);
      caveshbdlist->newindex((void **) &parysh);
      *parysh = searchsh;
    }
  }

  // Find and infect all exterior triangles.
  for (i = 0; i < caveshbdlist->objects; i++) {
    parysh = (face *) fastlookup(caveshbdlist, i);
    searchsh = *parysh;
    searchsh.shver = 0;
    for (j = 0; j < 3; j++) {
      spivot(searchsh, neighsh);
      if (neighsh.sh != NULL) {
        if (!isshsubseg(searchsh)) {
          if (!sinfected(neighsh)) {
            sinfect(neighsh);
            caveshbdlist->newindex((void **) &parysh);
            *parysh = neighsh;
          }
        } else {
          sdissolve(neighsh); // Disconnect a protected face.
        }
      }
      senextself(searchsh);
    }
  }

  // Delete exterior triangles, unmark interior triangles.
  for (i = 0; i < caveshlist->objects; i++) {
    parysh = (face *) fastlookup(caveshlist, i);
    if (sinfected(*parysh)) {
      shellfacedealloc(subfaces, parysh->sh);
    } else {
      sunmarktest(*parysh);
    }
  }

  caveshlist->restart();
  caveshbdlist->restart();
}